

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall ctemplate::Template::StripBuffer(Template *this,char **buffer,size_t *len)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  char *local_78;
  char *marker;
  char *end_marker;
  char *prev_pos;
  char *next_pos;
  MarkerDelimiters delim;
  char *write_pos;
  char *retval;
  char *bufend;
  size_t *len_local;
  char **buffer_local;
  Template *this_local;
  
  if (this->strip_ != DO_NOT_STRIP) {
    pcVar2 = *buffer + *len;
    pcVar3 = (char *)operator_new__(*len);
    delim.end_marker_len = (size_t)pcVar3;
    MarkerDelimiters::MarkerDelimiters((MarkerDelimiters *)&next_pos);
    end_marker = *buffer;
    while (end_marker < pcVar2) {
      pvVar4 = memchr(end_marker,10,(long)pcVar2 - (long)end_marker);
      prev_pos = pcVar2;
      if (pvVar4 != (void *)0x0) {
        prev_pos = (char *)((long)pvVar4 + 1);
      }
      sVar5 = InsertLine(end_marker,(long)prev_pos - (long)end_marker,this->strip_,
                         (MarkerDelimiters *)&next_pos,(char *)delim.end_marker_len);
      delim.end_marker_len = sVar5 + delim.end_marker_len;
      bVar1 = false;
      if (pcVar3 <= delim.end_marker_len) {
        bVar1 = delim.end_marker_len - (long)pcVar3 <= *len;
      }
      if (!bVar1) {
        __assert_fail("write_pos >= retval && static_cast<size_t>(write_pos-retval) <= *len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x9f4,"void ctemplate::Template::StripBuffer(char **, size_t *)");
      }
      local_78 = end_marker;
      while (((local_78 != (char *)0x0 &&
              (pcVar6 = anon_unknown_14::memmatch
                                  (local_78,(long)prev_pos - (long)local_78,next_pos,
                                   (size_t)delim.start_marker), pcVar6 != (char *)0x0)) &&
             (local_78 = anon_unknown_14::memmatch
                                   (pcVar6 + (long)delim.start_marker,
                                    (long)prev_pos - (long)(pcVar6 + (long)delim.start_marker),
                                    (char *)delim.start_marker_len,(size_t)delim.end_marker),
             local_78 != (char *)0x0))) {
        local_78 = delim.end_marker + (long)local_78;
        if ((long)(local_78 + (-(long)(pcVar6 + (long)delim.start_marker) - (long)delim.end_marker))
            < 0) {
          __assert_fail("((end_marker - delim.end_marker_len) - (marker + delim.start_marker_len)) >= 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0xa0a,"void ctemplate::Template::StripBuffer(char **, size_t *)");
        }
        ParseDelimiters(pcVar6 + (long)delim.start_marker,
                        (size_t)(local_78 +
                                (-(long)(pcVar6 + (long)delim.start_marker) - (long)delim.end_marker
                                )),(MarkerDelimiters *)&next_pos);
      }
      end_marker = prev_pos;
    }
    if (delim.end_marker_len < pcVar3) {
      __assert_fail("write_pos >= retval",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                    ,0xa11,"void ctemplate::Template::StripBuffer(char **, size_t *)");
    }
    if (*buffer != (char *)0x0) {
      operator_delete__(*buffer);
    }
    *buffer = pcVar3;
    *len = delim.end_marker_len - (long)pcVar3;
  }
  return;
}

Assistant:

void Template::StripBuffer(char **buffer, size_t* len) {
  if (strip_ == DO_NOT_STRIP)
    return;

  char* bufend = *buffer + *len;
  char* retval = new char[*len];
  char* write_pos = retval;

  MarkerDelimiters delim;

  const char* next_pos = NULL;
  for (const char* prev_pos = *buffer; prev_pos < bufend; prev_pos = next_pos) {
    next_pos = (char*)memchr(prev_pos, '\n', bufend - prev_pos);
    if (next_pos)
      next_pos++;          // include the newline
    else
      next_pos = bufend;   // for the last line, when it has no newline

    write_pos += InsertLine(prev_pos, next_pos - prev_pos, strip_, delim,
                            write_pos);
    assert(write_pos >= retval &&
           static_cast<size_t>(write_pos-retval) <= *len);

    // Before looking at the next line, see if the current line
    // changed the marker-delimiter.  We care for
    // IsBlankOrOnlyHasOneRemovableMarker, so we don't need to be
    // perfect -- we don't have to handle the delimiter changing in
    // the middle of a line -- just make sure that the next time
    // there's only one marker on a line, we notice because we know
    // the right delim.
    const char* end_marker = NULL;
    for (const char* marker = prev_pos; marker; marker = end_marker) {
      marker = memmatch(marker, next_pos - marker,
                        delim.start_marker, delim.start_marker_len);
      if (!marker)  break;
      end_marker = memmatch(marker + delim.start_marker_len,
                            next_pos - (marker + delim.start_marker_len),
                            delim.end_marker, delim.end_marker_len);
      if (!end_marker)  break;
      end_marker += delim.end_marker_len;  // needed for the for loop
      // This tries to parse the marker as a set-delimiters marker.
      // If it succeeds, it updates delim. If not, it ignores it.
      assert(((end_marker - delim.end_marker_len)
              - (marker + delim.start_marker_len)) >= 0);
      Template::ParseDelimiters(marker + delim.start_marker_len,
                                ((end_marker - delim.end_marker_len)
                                 - (marker + delim.start_marker_len)),
                                &delim);
    }
  }
  assert(write_pos >= retval);

  // Replace the input retval with our new retval.
  delete[] *buffer;
  *buffer = retval;
  *len = static_cast<size_t>(write_pos - retval);
}